

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void stbtt__handle_clipped_edge
               (float *scanline,int x,stbtt__active_edge *e,float x0,float y0,float x1,float y1)

{
  float fVar1;
  float fVar2;
  
  if ((((y0 != y1) || (NAN(y0) || NAN(y1))) && (fVar2 = e->ey, y0 <= fVar2)) &&
     (fVar1 = e->sy, fVar1 <= y1)) {
    if (y0 < fVar1) {
      x0 = x0 + ((fVar1 - y0) * (x1 - x0)) / (y1 - y0);
      y0 = fVar1;
    }
    if (fVar2 < y1) {
      x1 = x1 + ((fVar2 - y1) * (x1 - x0)) / (y1 - y0);
      y1 = fVar2;
    }
    fVar2 = (float)x;
    if ((x0 <= fVar2) && (x1 <= fVar2)) {
      scanline[x] = (y1 - y0) * e->direction + scanline[x];
      return;
    }
    if ((x0 < (float)(x + 1)) || (x1 < (float)(x + 1))) {
      scanline[x] = (((x1 - fVar2) + (x0 - fVar2)) * -0.5 + 1.0) * (y1 - y0) * e->direction +
                    scanline[x];
      return;
    }
  }
  return;
}

Assistant:

static void stbtt__handle_clipped_edge(float *scanline, int x, stbtt__active_edge *e, float x0, float y0, float x1, float y1)
{
if (y0 == y1) return;
STBTT_assert(y0 < y1);
STBTT_assert(e->sy <= e->ey);
if (y0 > e->ey) return;
if (y1 < e->sy) return;
if (y0 < e->sy) {
x0 += (x1-x0) * (e->sy - y0) / (y1-y0);
y0 = e->sy;
}
if (y1 > e->ey) {
x1 += (x1-x0) * (e->ey - y1) / (y1-y0);
y1 = e->ey;
}

if (x0 == x)
STBTT_assert(x1 <= x+1);
else if (x0 == x+1)
STBTT_assert(x1 >= x);
else if (x0 <= x)
STBTT_assert(x1 <= x);
else if (x0 >= x+1)
STBTT_assert(x1 >= x+1);
else
STBTT_assert(x1 >= x && x1 <= x+1);

if (x0 <= x && x1 <= x)
scanline[x] += e->direction * (y1-y0);
else if (x0 >= x+1 && x1 >= x+1)
;
else {
STBTT_assert(x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1);
scanline[x] += e->direction * (y1-y0) * (1-((x0-x)+(x1-x))/2); /*  coverage = 1 - average x position */
}
}